

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_fma.cpp
# Opt level: O3

void ncnn::softmax(float *_ptr,int elemcount,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 (*pauVar4) [32];
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  float *ptr;
  uint uVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar11 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar22 [16];
  undefined1 extraout_var [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar28 [16];
  undefined1 auVar32 [64];
  __m128 _sum0;
  undefined1 auVar33 [16];
  undefined1 auVar38 [28];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  float fVar53;
  float fVar54;
  undefined1 auVar45 [16];
  float fVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_b8 [16];
  undefined1 auVar16 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar41 [32];
  
  auVar69 = in_ZMM6._0_16_;
  uVar10 = elemcount * elempack;
  pauVar4 = (undefined1 (*) [32])_ptr;
  if ((int)uVar10 < 8) {
    auVar32 = ZEXT3264(CONCAT428(0xff7fffff,
                                 CONCAT424(0xff7fffff,
                                           CONCAT420(0xff7fffff,
                                                     CONCAT416(0xff7fffff,
                                                               CONCAT412(0xff7fffff,
                                                                         CONCAT48(0xff7fffff,
                                                                                  0xff7fffffff7fffff
                                                                                 )))))));
    uVar5 = 0;
  }
  else {
    uVar5 = uVar10 & 0x7ffffff8;
    auVar32 = ZEXT3264(CONCAT428(0xff7fffff,
                                 CONCAT424(0xff7fffff,
                                           CONCAT420(0xff7fffff,
                                                     CONCAT416(0xff7fffff,
                                                               CONCAT412(0xff7fffff,
                                                                         CONCAT48(0xff7fffff,
                                                                                  0xff7fffffff7fffff
                                                                                 )))))));
    iVar8 = 7;
    do {
      auVar39 = vmaxps_avx(auVar32._0_32_,*pauVar4);
      auVar32 = ZEXT3264(auVar39);
      pauVar4 = pauVar4 + 1;
      iVar8 = iVar8 + 8;
    } while (iVar8 < (int)uVar10);
  }
  auVar13._8_4_ = 0xff7fffff;
  auVar13._0_8_ = 0xff7fffffff7fffff;
  auVar13._12_4_ = 0xff7fffff;
  uVar9 = uVar5 | 3;
  while ((int)uVar9 < (int)uVar10) {
    auVar13 = vmaxps_avx(auVar13,*(undefined1 (*) [16])*pauVar4);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + 0x10);
    uVar9 = uVar5 + 7;
    uVar5 = uVar5 + 4;
  }
  if ((int)uVar5 < (int)uVar10) {
    uVar7 = CONCAT44(0,~uVar5 + uVar10);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar7;
    auVar60 = vpshufd_avx(auVar33,0x44);
    auVar39._8_4_ = 0xff7fffff;
    auVar39._0_8_ = 0xff7fffffff7fffff;
    auVar39._12_4_ = 0xff7fffff;
    auVar39._16_4_ = 0xff7fffff;
    auVar39._20_4_ = 0xff7fffff;
    auVar39._24_4_ = 0xff7fffff;
    auVar39._28_4_ = 0xff7fffff;
    uVar6 = 0;
    auVar59._8_8_ = 0x8000000000000000;
    auVar59._0_8_ = 0x8000000000000000;
    auVar69 = vorps_avx(auVar60,auVar59);
    auVar33 = vorps_avx(auVar60,auVar59);
    auVar35 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
    auVar82 = vorps_avx(auVar60,auVar59);
    do {
      auVar41 = auVar39;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar6;
      auVar75 = vpshufd_avx(auVar75,0x44);
      auVar79._16_16_ = auVar75;
      auVar79._0_16_ = auVar75;
      auVar70 = vorps_avx(auVar79,_DAT_005a58c0);
      auVar79 = vorps_avx(auVar79,_DAT_005a58e0);
      auVar22._0_8_ = auVar79._16_8_ ^ 0x8000000000000000;
      auVar22._8_4_ = auVar79._24_4_;
      auVar22._12_4_ = auVar79._28_4_ ^ 0x80000000;
      auVar22 = vpcmpgtq_avx(auVar22,auVar69);
      auVar85._0_8_ = auVar79._0_8_ ^ 0x8000000000000000;
      auVar85._8_4_ = auVar79._8_4_;
      auVar85._12_4_ = auVar79._12_4_ ^ 0x80000000;
      auVar75 = vpcmpgtq_avx(auVar85,auVar33);
      auVar75 = vpackssdw_avx(auVar75,auVar22);
      auVar86._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
      auVar86._8_4_ = auVar70._24_4_;
      auVar86._12_4_ = auVar70._28_4_ ^ 0x80000000;
      auVar85 = vpcmpgtq_avx(auVar86,auVar69);
      auVar45._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
      auVar45._8_4_ = auVar70._8_4_;
      auVar45._12_4_ = auVar70._12_4_ ^ 0x80000000;
      auVar45 = vpcmpgtq_avx(auVar45,auVar82);
      auVar45 = vpackssdw_avx(auVar45,auVar85);
      auVar75 = vpackssdw_avx(auVar35 ^ auVar45,auVar75 ^ auVar35);
      auVar45 = vpmovsxwd_avx(auVar75);
      auVar75 = vpunpckhwd_avx(auVar75,auVar75);
      auVar50._16_16_ = auVar75;
      auVar50._0_16_ = auVar45;
      auVar39 = vmaskmovps_avx(auVar50,*(undefined1 (*) [32])(*pauVar4 + uVar6 * 4));
      auVar39 = vmaxps_avx(auVar39,auVar41);
      uVar6 = uVar6 + 8;
    } while ((uVar7 + 8 & 0x1fffffff8) != uVar6);
    auVar69 = vorps_avx(auVar60,auVar59);
    auVar35._0_8_ = auVar79._0_8_ ^ 0x8000000000000000;
    auVar35._8_4_ = auVar79._8_4_;
    auVar35._12_4_ = auVar79._12_4_ ^ 0x80000000;
    auVar69 = vpcmpgtq_avx(auVar35,auVar69);
    auVar82 = vpackssdw_avx(auVar69,auVar22);
    auVar35 = vpcmpeqd_avx(auVar35,auVar35);
    auVar69 = vorps_avx(auVar60,auVar59);
    auVar60._8_4_ = auVar70._8_4_;
    auVar60._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
    auVar60._12_4_ = auVar70._12_4_ ^ 0x80000000;
    auVar33 = vpcmpgtq_avx(auVar60,auVar69);
    auVar33 = vpackssdw_avx(auVar33,auVar85);
    auVar33 = vblendvps_avx(auVar41._0_16_,auVar39._0_16_,auVar33 ^ auVar35);
    auVar82 = vblendvps_avx(auVar41._16_16_,auVar39._16_16_,auVar82 ^ auVar35);
    auVar33 = vmaxps_avx(auVar33,auVar82);
    auVar82 = vshufpd_avx(auVar33,auVar33,1);
    auVar33 = vmaxps_avx(auVar33,auVar82);
    auVar82 = vmovshdup_avx(auVar33);
    auVar33 = vmaxss_avx(auVar33,auVar82);
  }
  else {
    auVar33 = SUB6416(ZEXT464(0xff7fffff),0);
  }
  if (elempack == 4) {
    auVar82 = vmaxps_avx(auVar32._0_16_,auVar32._16_16_);
    auVar13 = vmaxps_avx(auVar13,auVar82);
    auVar32 = ZEXT3264(CONCAT1616(auVar13,auVar13));
  }
  else if (elempack == 1) {
    auVar82 = vmaxps_avx(auVar32._16_16_,auVar32._0_16_);
    auVar35 = vshufpd_avx(auVar82,auVar82,3);
    auVar82 = vmaxps_avx(auVar82,auVar35);
    auVar35 = vmovshdup_avx(auVar82);
    auVar82 = vmaxss_avx(auVar82,auVar35);
    auVar33 = vmaxss_avx(auVar82,auVar33);
    auVar82 = vshufpd_avx(auVar13,auVar13,3);
    auVar13 = vmaxps_avx(auVar13,auVar82);
    auVar82 = vmovshdup_avx(auVar13);
    auVar13 = vmaxss_avx(auVar13,auVar82);
    auVar33 = vmaxss_avx(auVar13,auVar33);
    auVar13 = vshufps_avx(auVar33,auVar33,0);
    auVar32 = ZEXT3264(CONCAT1616(auVar13,auVar13));
    bVar3 = true;
    goto LAB_00347e24;
  }
  bVar3 = false;
LAB_00347e24:
  pauVar4 = (undefined1 (*) [32])_ptr;
  if ((int)uVar10 < 8) {
    fVar61 = 0.0;
    fVar62 = 0.0;
    fVar63 = 0.0;
    fVar64 = 0.0;
    fVar65 = 0.0;
    fVar66 = 0.0;
    fVar67 = 0.0;
    fVar68 = 0.0;
    uVar5 = 0;
  }
  else {
    uVar5 = uVar10 & 0x7ffffff8;
    fVar61 = 0.0;
    fVar62 = 0.0;
    fVar63 = 0.0;
    fVar64 = 0.0;
    fVar65 = 0.0;
    fVar66 = 0.0;
    fVar67 = 0.0;
    fVar68 = 0.0;
    iVar8 = 7;
    auVar69._8_4_ = 0x3f000000;
    auVar69._0_8_ = 0x3f0000003f000000;
    auVar69._12_4_ = 0x3f000000;
    auVar70._8_4_ = 0x3f800000;
    auVar70._0_8_ = 0x3f8000003f800000;
    auVar70._12_4_ = 0x3f800000;
    auVar70._16_4_ = 0x3f800000;
    auVar70._20_4_ = 0x3f800000;
    auVar70._24_4_ = 0x3f800000;
    auVar70._28_4_ = 0x3f800000;
    auVar82._8_4_ = 0x3f800000;
    auVar82._0_8_ = 0x3f8000003f800000;
    auVar82._12_4_ = 0x3f800000;
    do {
      auVar39 = vsubps_avx(*pauVar4,auVar32._0_32_);
      auVar51._8_4_ = 0x42b0c0a5;
      auVar51._0_8_ = 0x42b0c0a542b0c0a5;
      auVar51._12_4_ = 0x42b0c0a5;
      auVar51._16_4_ = 0x42b0c0a5;
      auVar51._20_4_ = 0x42b0c0a5;
      auVar51._24_4_ = 0x42b0c0a5;
      auVar51._28_4_ = 0x42b0c0a5;
      auVar39 = vminps_avx(auVar39,auVar51);
      auVar52._8_4_ = 0xc2b0c0a5;
      auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar52._12_4_ = 0xc2b0c0a5;
      auVar52._16_4_ = 0xc2b0c0a5;
      auVar52._20_4_ = 0xc2b0c0a5;
      auVar52._24_4_ = 0xc2b0c0a5;
      auVar52._28_4_ = 0xc2b0c0a5;
      auVar79 = vmaxps_avx(auVar39,auVar52);
      auVar40._0_4_ = auVar79._0_4_ * 1.442695 + 0.5;
      auVar40._4_4_ = auVar79._4_4_ * 1.442695 + 0.5;
      auVar40._8_4_ = auVar79._8_4_ * 1.442695 + 0.5;
      auVar40._12_4_ = auVar79._12_4_ * 1.442695 + 0.5;
      auVar40._16_4_ = auVar79._16_4_ * 1.442695 + 0.5;
      auVar40._20_4_ = auVar79._20_4_ * 1.442695 + 0.5;
      auVar40._24_4_ = auVar79._24_4_ * 1.442695 + 0.5;
      auVar40._28_4_ = 0x3ff8aa3b;
      auVar41 = vroundps_avx(auVar40,1);
      auVar39 = vcmpps_avx(auVar40,auVar41,1);
      auVar39 = vandps_avx(auVar39,auVar70);
      auVar39 = vsubps_avx(auVar41,auVar39);
      fVar44 = auVar79._0_4_ + auVar39._0_4_ * -0.6931472;
      fVar53 = auVar79._4_4_ + auVar39._4_4_ * -0.6931472;
      fVar54 = auVar79._8_4_ + auVar39._8_4_ * -0.6931472;
      fVar55 = auVar79._12_4_ + auVar39._12_4_ * -0.6931472;
      fVar56 = auVar79._16_4_ + auVar39._16_4_ * -0.6931472;
      fVar57 = auVar79._20_4_ + auVar39._20_4_ * -0.6931472;
      fVar58 = auVar79._24_4_ + auVar39._24_4_ * -0.6931472;
      auVar34._0_4_ = (int)auVar39._0_4_;
      auVar34._4_4_ = (int)auVar39._4_4_;
      auVar34._8_4_ = (int)auVar39._8_4_;
      auVar34._12_4_ = (int)auVar39._12_4_;
      auVar41._16_4_ = (int)auVar39._16_4_;
      auVar41._0_16_ = auVar34;
      auVar41._20_4_ = (int)auVar39._20_4_;
      auVar41._24_4_ = (int)auVar39._24_4_;
      auVar41._28_4_ = (int)auVar39._28_4_;
      auVar60 = vpslld_avx(auVar34,0x17);
      auVar35 = vpslld_avx(auVar41._16_16_,0x17);
      auVar35 = vpaddd_avx(auVar82,auVar35);
      auVar60 = vpaddd_avx(auVar82,auVar60);
      fVar44 = (fVar44 + 1.0 +
               fVar44 * fVar44 *
               (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                 0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar60._0_4_;
      fVar53 = (fVar53 + 1.0 +
               fVar53 * fVar53 *
               (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                 0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5)) * auVar60._4_4_;
      fVar54 = (fVar54 + 1.0 +
               fVar54 * fVar54 *
               (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                 0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5)) * auVar60._8_4_;
      fVar55 = (fVar55 + 1.0 +
               fVar55 * fVar55 *
               (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5)) * auVar60._12_4_;
      fVar56 = (fVar56 + 1.0 +
               fVar56 * fVar56 *
               (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar35._0_4_;
      fVar57 = (fVar57 + 1.0 +
               fVar57 * fVar57 *
               (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                 0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5)) * auVar35._4_4_;
      fVar58 = (fVar58 + 1.0 +
               fVar58 * fVar58 *
               (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                 0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5)) * auVar35._8_4_;
      *(float *)*pauVar4 = fVar44;
      *(float *)(*pauVar4 + 4) = fVar53;
      *(float *)(*pauVar4 + 8) = fVar54;
      *(float *)(*pauVar4 + 0xc) = fVar55;
      *(float *)(*pauVar4 + 0x10) = fVar56;
      *(float *)(*pauVar4 + 0x14) = fVar57;
      *(float *)(*pauVar4 + 0x18) = fVar58;
      *(float *)(*pauVar4 + 0x1c) = auVar35._12_4_;
      fVar61 = fVar44 + fVar61;
      fVar62 = fVar53 + fVar62;
      fVar63 = fVar54 + fVar63;
      fVar64 = fVar55 + fVar64;
      fVar65 = fVar56 + fVar65;
      fVar66 = fVar57 + fVar66;
      fVar67 = fVar58 + fVar67;
      fVar68 = auVar35._12_4_ + fVar68;
      pauVar4 = pauVar4 + 1;
      iVar8 = iVar8 + 8;
    } while (iVar8 < (int)uVar10);
  }
  auVar83 = (undefined1  [16])0x0;
  if ((int)(uVar5 | 3) < (int)uVar10) {
    auVar84 = ZEXT1664((undefined1  [16])0x0);
    auVar46._8_4_ = 0xc2b0c0a5;
    auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar46._12_4_ = 0xc2b0c0a5;
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    uVar9 = uVar5;
    do {
      auVar82 = vsubps_avx(*(undefined1 (*) [16])*pauVar4,auVar13);
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar82 = vminps_avx(auVar82,auVar23);
      auVar60 = vmaxps_avx(auVar82,auVar46);
      auVar32 = ZEXT3264(auVar84._0_32_);
      auVar80._0_4_ = auVar60._0_4_ * 1.442695 + 0.5;
      auVar80._4_4_ = auVar60._4_4_ * 1.442695 + 0.5;
      auVar80._8_4_ = auVar60._8_4_ * 1.442695 + 0.5;
      auVar80._12_4_ = auVar60._12_4_ * 1.442695 + 0.5;
      auVar87._0_4_ = (int)auVar80._0_4_;
      auVar87._4_4_ = (int)auVar80._4_4_;
      auVar87._8_4_ = (int)auVar80._8_4_;
      auVar87._12_4_ = (int)auVar80._12_4_;
      auVar35 = vcvtdq2ps_avx(auVar87);
      auVar82 = vcmpps_avx(auVar80,auVar35,1);
      auVar82 = vandps_avx(auVar82,auVar69);
      auVar82 = vsubps_avx(auVar35,auVar82);
      fVar44 = auVar82._0_4_ * -0.6931472 + auVar60._0_4_;
      fVar53 = auVar82._4_4_ * -0.6931472 + auVar60._4_4_;
      fVar54 = auVar82._8_4_ * -0.6931472 + auVar60._8_4_;
      fVar55 = auVar82._12_4_ * -0.6931472 + auVar60._12_4_;
      auVar81._0_4_ = (int)auVar82._0_4_;
      auVar81._4_4_ = (int)auVar82._4_4_;
      auVar81._8_4_ = (int)auVar82._8_4_;
      auVar81._12_4_ = (int)auVar82._12_4_;
      auVar82 = vpslld_avx(auVar81,0x17);
      auVar82 = vpaddd_avx(auVar82,auVar69);
      fVar44 = auVar82._0_4_ *
               (fVar44 * fVar44 *
                (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                  0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) + fVar44 + 1.0);
      fVar53 = auVar82._4_4_ *
               (fVar53 * fVar53 *
                (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                  0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5) + fVar53 + 1.0);
      fVar54 = auVar82._8_4_ *
               (fVar54 * fVar54 *
                (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                  0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) + fVar54 + 1.0);
      fVar55 = auVar82._12_4_ *
               (fVar55 * fVar55 *
                (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                  0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) + fVar55 + 1.0);
      *(float *)*pauVar4 = fVar44;
      *(float *)(*pauVar4 + 4) = fVar53;
      *(float *)(*pauVar4 + 8) = fVar54;
      *(float *)(*pauVar4 + 0xc) = fVar55;
      auVar83._0_4_ = auVar84._0_4_ + fVar44;
      auVar83._4_4_ = auVar84._4_4_ + fVar53;
      auVar83._8_4_ = auVar84._8_4_ + fVar54;
      auVar83._12_4_ = auVar84._12_4_ + fVar55;
      auVar84 = ZEXT1664(auVar83);
      pauVar4 = (undefined1 (*) [32])(*pauVar4 + 0x10);
      uVar5 = uVar9 + 4;
      iVar8 = uVar9 + 7;
      uVar9 = uVar5;
    } while (iVar8 < (int)uVar10);
  }
  auVar13 = ZEXT816(0) << 0x40;
  if ((int)uVar5 < (int)uVar10) {
    uVar7 = CONCAT44(0,~uVar5 + uVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar7;
    auVar35 = vpshufd_avx(auVar11,0x44);
    auVar69 = vpermilps_avx(auVar33,0);
    auVar14._16_16_ = auVar69;
    auVar14._0_16_ = auVar69;
    uVar6 = 0;
    auVar47._8_8_ = 0x8000000000000000;
    auVar47._0_8_ = 0x8000000000000000;
    auVar13 = vorps_avx(auVar35,auVar47);
    auVar33 = vorps_avx(auVar35,auVar47);
    auVar82 = vorps_avx(auVar35,auVar47);
    auVar32 = ZEXT864(0) << 0x20;
    do {
      auVar84 = auVar32;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar6;
      auVar69 = vpshufd_avx(auVar24,0x44);
      auVar29._16_16_ = auVar69;
      auVar29._0_16_ = auVar69;
      auVar70 = vorps_avx(auVar29,_DAT_005a58c0);
      auVar79 = vorps_avx(auVar29,_DAT_005a58e0);
      auVar75 = vpcmpgtq_avx(auVar79._16_16_ ^ auVar47,auVar13);
      auVar69 = vpcmpgtq_avx(auVar79._0_16_ ^ auVar47,auVar33);
      auVar60 = vpackssdw_avx(auVar69,auVar75);
      auVar69 = vpcmpeqd_avx(auVar75,auVar75);
      auVar45 = vpcmpgtq_avx(auVar70._16_16_ ^ auVar47,auVar13);
      auVar36._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
      auVar36._8_4_ = auVar70._8_4_;
      auVar36._12_4_ = auVar70._12_4_ ^ 0x80000000;
      auVar59 = vpcmpgtq_avx(auVar36,auVar82);
      auVar59 = vpackssdw_avx(auVar59,auVar45);
      auVar60 = vpackssdw_avx(auVar59 ^ auVar69,auVar60 ^ auVar69);
      auVar59 = vpmovsxwd_avx(auVar60);
      auVar60 = vpunpckhwd_avx(auVar60,auVar60);
      auVar30._16_16_ = auVar60;
      auVar30._0_16_ = auVar59;
      auVar39 = vmaskmovps_avx(auVar30,*(undefined1 (*) [32])(*pauVar4 + uVar6 * 4));
      auVar39 = vsubps_avx(auVar39,auVar14);
      auVar22 = auVar39._16_16_;
      local_1e8._0_4_ = expf(auVar39._16_4_);
      local_1e8._4_4_ = extraout_XMM0_Db;
      local_1e8._8_4_ = extraout_XMM0_Dc;
      local_1e8._12_4_ = extraout_XMM0_Dd;
      auVar60 = vmovshdup_avx(auVar22);
      auVar32._0_4_ = expf(auVar60._0_4_);
      auVar32._4_60_ = extraout_var;
      auVar60 = vinsertps_avx(local_1e8,auVar32._0_16_,0x10);
      auVar59 = vpermilpd_avx(auVar22,1);
      auVar17._0_4_ = expf(auVar59._0_4_);
      auVar17._4_60_ = extraout_var_00;
      auVar60 = vinsertps_avx(auVar60,auVar17._0_16_,0x20);
      auVar59 = vpermilps_avx(auVar22,0xff);
      auVar18._0_4_ = expf(auVar59._0_4_);
      auVar18._4_60_ = extraout_var_01;
      auVar60 = vinsertps_avx(auVar60,auVar18._0_16_,0x30);
      local_1b8._0_4_ = auVar39._0_4_;
      local_1e8._0_4_ = expf((float)local_1b8._0_4_);
      local_1e8._4_4_ = extraout_XMM0_Db_00;
      local_1e8._8_4_ = extraout_XMM0_Dc_00;
      local_1e8._12_4_ = extraout_XMM0_Dd_00;
      local_1b8 = auVar39._0_16_;
      auVar59 = vmovshdup_avx(local_1b8);
      auVar19._0_4_ = expf(auVar59._0_4_);
      auVar19._4_60_ = extraout_var_02;
      auVar59 = vinsertps_avx(local_1e8,auVar19._0_16_,0x10);
      auVar22 = vpermilpd_avx(local_1b8,1);
      auVar20._0_4_ = expf(auVar22._0_4_);
      auVar20._4_60_ = extraout_var_03;
      auVar59 = vinsertps_avx(auVar59,auVar20._0_16_,0x20);
      auVar22 = vpermilps_avx(local_1b8,0xff);
      auVar21._0_4_ = expf(auVar22._0_4_);
      auVar21._4_60_ = extraout_var_04;
      auVar59 = vinsertps_avx(auVar59,auVar21._0_16_,0x30);
      auVar15._16_16_ = auVar60;
      auVar15._0_16_ = auVar59;
      auVar39 = vmaskmovps_avx(auVar30,auVar15);
      *(undefined1 (*) [32])(*pauVar4 + uVar6 * 4) = auVar39;
      auVar12._0_4_ = auVar59._0_4_ + auVar84._0_4_;
      auVar12._4_4_ = auVar59._4_4_ + auVar84._4_4_;
      auVar12._8_4_ = auVar59._8_4_ + auVar84._8_4_;
      auVar12._12_4_ = auVar59._12_4_ + auVar84._12_4_;
      auVar16._16_4_ = auVar60._0_4_ + auVar84._16_4_;
      auVar16._0_16_ = auVar12;
      auVar16._20_4_ = auVar60._4_4_ + auVar84._20_4_;
      auVar16._24_4_ = auVar60._8_4_ + auVar84._24_4_;
      auVar16._28_4_ = auVar60._12_4_ + auVar84._28_4_;
      uVar6 = uVar6 + 8;
      auVar32 = ZEXT3264(auVar16);
    } while ((uVar7 + 8 & 0x1fffffff8) != uVar6);
    auVar13 = vpor_avx(auVar35,auVar47);
    auVar82 = auVar47 ^ auVar79._0_16_;
    auVar13 = vpcmpgtq_avx(auVar82,auVar13);
    auVar33 = vpackssdw_avx(auVar13,auVar75);
    auVar82 = vpcmpeqd_avx(auVar82,auVar82);
    auVar32 = ZEXT1664(auVar33 ^ auVar82);
    auVar13 = vpor_avx(auVar35,auVar47);
    local_b8 = auVar70._0_16_;
    auVar13 = vpcmpgtq_avx(auVar47 ^ local_b8,auVar13);
    auVar13 = vpackssdw_avx(auVar13,auVar45);
    auVar13 = vblendvps_avx(auVar84._0_16_,auVar12,auVar13 ^ auVar82);
    auVar33 = vblendvps_avx(auVar84._16_16_,auVar16._16_16_,auVar33 ^ auVar82);
    auVar13 = vhaddps_avx(auVar33,auVar13);
    auVar13 = vhaddps_avx(auVar13,auVar13);
    auVar13 = vhaddps_avx(auVar13,auVar13);
  }
  if (elempack == 8) {
    auVar31._8_4_ = 0x3f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar31._12_4_ = 0x3f800000;
    auVar31._16_4_ = 0x3f800000;
    auVar31._20_4_ = 0x3f800000;
    auVar31._24_4_ = 0x3f800000;
    auVar31._28_4_ = 0x3f800000;
    auVar32 = ZEXT3264(auVar31);
    auVar2._4_4_ = fVar62;
    auVar2._0_4_ = fVar61;
    auVar2._8_4_ = fVar63;
    auVar2._12_4_ = fVar64;
    auVar2._16_4_ = fVar65;
    auVar2._20_4_ = fVar66;
    auVar2._24_4_ = fVar67;
    auVar2._28_4_ = fVar68;
    auVar42 = vdivps_avx(auVar31,auVar2);
  }
  else {
    auVar42._4_4_ = fVar62;
    auVar42._0_4_ = fVar61;
    auVar42._8_4_ = fVar63;
    auVar42._12_4_ = fVar64;
    auVar42._16_4_ = fVar65;
    auVar42._20_4_ = fVar66;
    auVar42._24_4_ = fVar67;
    auVar42._28_4_ = fVar68;
    if (elempack == 4) {
      auVar25._0_4_ = auVar83._0_4_ + fVar65 + fVar61;
      auVar25._4_4_ = auVar83._4_4_ + fVar66 + fVar62;
      auVar25._8_4_ = auVar83._8_4_ + fVar67 + fVar63;
      auVar25._12_4_ = auVar83._12_4_ + fVar68 + fVar64;
      auVar32 = ZEXT1664(auVar25);
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      auVar83 = vdivps_avx(auVar37,auVar25);
      auVar42._16_16_ = auVar83;
      auVar42._0_16_ = auVar83;
    }
  }
  auVar38 = auVar42._0_28_;
  if (bVar3) {
    auVar26._0_4_ = auVar42._16_4_ + auVar42._0_4_;
    auVar26._4_4_ = auVar42._20_4_ + auVar42._4_4_;
    auVar26._8_4_ = auVar42._24_4_ + auVar42._8_4_;
    auVar26._12_4_ = auVar42._28_4_ + auVar42._12_4_;
    auVar33 = vshufpd_avx(auVar26,auVar26,1);
    auVar27._0_4_ = auVar33._0_4_ + auVar26._0_4_;
    auVar27._4_4_ = auVar33._4_4_ + auVar26._4_4_;
    auVar27._8_4_ = auVar33._8_4_ + auVar26._8_4_;
    auVar27._12_4_ = auVar33._12_4_ + auVar26._12_4_;
    auVar33 = vmovshdup_avx(auVar27);
    auVar82 = vshufpd_avx(auVar83,auVar83,1);
    auVar48._0_4_ = auVar83._0_4_ + auVar82._0_4_;
    auVar48._4_4_ = auVar83._4_4_ + auVar82._4_4_;
    auVar48._8_4_ = auVar83._8_4_ + auVar82._8_4_;
    auVar48._12_4_ = auVar83._12_4_ + auVar82._12_4_;
    auVar82 = vmovshdup_avx(auVar48);
    auVar32 = ZEXT464(0x3f800000);
    auVar13 = ZEXT416((uint)(1.0 / (auVar82._0_4_ + auVar33._0_4_ +
                                   auVar13._0_4_ + auVar48._0_4_ + auVar27._0_4_)));
    auVar83 = vshufps_avx(auVar13,auVar13,0);
    auVar43._16_16_ = auVar83;
    auVar43._0_16_ = auVar83;
    auVar38 = auVar43._0_28_;
  }
  uVar5 = 0;
  if (7 < (int)uVar10) {
    uVar5 = uVar10 & 0x7ffffff8;
    iVar8 = 7;
    do {
      auVar84._0_4_ = auVar38._0_4_ * *(float *)*(undefined1 (*) [32])_ptr;
      auVar84._4_4_ = auVar38._4_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 4);
      auVar84._8_4_ = auVar38._8_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 8);
      auVar84._12_4_ = auVar38._12_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0xc);
      auVar84._16_4_ = auVar38._16_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0x10);
      auVar84._20_4_ = auVar38._20_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0x14);
      auVar84._28_36_ = auVar32._28_36_;
      auVar84._24_4_ = auVar38._24_4_ * *(float *)((long)*(undefined1 (*) [32])_ptr + 0x18);
      auVar32 = ZEXT3264(auVar84._0_32_);
      *(undefined1 (*) [32])_ptr = auVar84._0_32_;
      _ptr = (float *)((long)_ptr + 0x20);
      iVar8 = iVar8 + 8;
    } while (iVar8 < (int)uVar10);
  }
  uVar9 = uVar5 | 3;
  auVar39 = _DAT_005a58c0;
  auVar70 = _DAT_005a58e0;
  while (_DAT_005a58c0 = auVar39, _DAT_005a58e0 = auVar70, (int)uVar9 < (int)uVar10) {
    fVar61 = *(float *)((long)*(undefined1 (*) [32])_ptr + 4);
    fVar62 = *(float *)((long)*(undefined1 (*) [32])_ptr + 8);
    fVar63 = *(float *)((long)*(undefined1 (*) [32])_ptr + 0xc);
    *(float *)*(undefined1 (*) [32])_ptr = auVar83._0_4_ * *(float *)*(undefined1 (*) [32])_ptr;
    *(float *)((long)*(undefined1 (*) [32])_ptr + 4) = auVar83._4_4_ * fVar61;
    *(float *)((long)*(undefined1 (*) [32])_ptr + 8) = auVar83._8_4_ * fVar62;
    *(float *)((long)*(undefined1 (*) [32])_ptr + 0xc) = auVar83._12_4_ * fVar63;
    _ptr = (float *)((long)*(undefined1 (*) [32])_ptr + 0x10);
    uVar9 = uVar5 + 7;
    uVar5 = uVar5 + 4;
    auVar39 = _DAT_005a58c0;
    auVar70 = _DAT_005a58e0;
  }
  if ((int)uVar5 < (int)uVar10) {
    uVar6 = CONCAT44(0,uVar10 + ~uVar5);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar6;
    auVar35 = vpshufd_avx(auVar28,0x44);
    auVar60 = vshufps_avx(auVar13,auVar13,0);
    uVar7 = 0;
    auVar49._8_8_ = 0x8000000000000000;
    auVar49._0_8_ = 0x8000000000000000;
    auVar13 = vorps_avx(auVar35,auVar49);
    auVar33 = vorps_avx(auVar35,auVar49);
    auVar82 = vpcmpeqd_avx(auVar69,auVar69);
    auVar69 = vorps_avx(auVar35,auVar49);
    do {
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar7;
      auVar35 = vpshufd_avx(auVar71,0x44);
      auVar73._16_16_ = auVar35;
      auVar73._0_16_ = auVar35;
      auVar79 = vorps_avx(auVar73,auVar39);
      auVar41 = vorps_avx(auVar73,auVar70);
      auVar77._0_8_ = auVar41._16_8_ ^ 0x8000000000000000;
      auVar77._8_4_ = auVar41._24_4_;
      auVar77._12_4_ = auVar41._28_4_ ^ 0x80000000;
      auVar35 = vpcmpgtq_avx(auVar77,auVar13);
      auVar72._0_8_ = auVar41._0_8_ ^ 0x8000000000000000;
      auVar72._8_4_ = auVar41._8_4_;
      auVar72._12_4_ = auVar41._12_4_ ^ 0x80000000;
      auVar59 = vpcmpgtq_avx(auVar72,auVar33);
      auVar35 = vpackssdw_avx(auVar59,auVar35);
      auVar78._0_8_ = auVar79._16_8_ ^ 0x8000000000000000;
      auVar78._8_4_ = auVar79._24_4_;
      auVar78._12_4_ = auVar79._28_4_ ^ 0x80000000;
      auVar59 = vpcmpgtq_avx(auVar78,auVar13);
      auVar76._0_8_ = auVar79._0_8_ ^ 0x8000000000000000;
      auVar76._8_4_ = auVar79._8_4_;
      auVar76._12_4_ = auVar79._12_4_ ^ 0x80000000;
      auVar75 = vpcmpgtq_avx(auVar76,auVar69);
      auVar59 = vpackssdw_avx(auVar75,auVar59);
      auVar35 = vpackssdw_avx(auVar59 ^ auVar82,auVar35 ^ auVar82);
      auVar59 = vpmovsxwd_avx(auVar35);
      auVar35 = vpunpckhwd_avx(auVar35,auVar35);
      auVar74._16_16_ = auVar35;
      auVar74._0_16_ = auVar59;
      auVar79 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])
                                        ((long)*(undefined1 (*) [32])_ptr + uVar7 * 4));
      auVar1._4_4_ = auVar79._4_4_ * auVar60._4_4_;
      auVar1._0_4_ = auVar79._0_4_ * auVar60._0_4_;
      auVar1._8_4_ = auVar79._8_4_ * auVar60._8_4_;
      auVar1._12_4_ = auVar79._12_4_ * auVar60._12_4_;
      auVar1._16_4_ = auVar79._16_4_ * auVar60._0_4_;
      auVar1._20_4_ = auVar79._20_4_ * auVar60._4_4_;
      auVar1._24_4_ = auVar79._24_4_ * auVar60._8_4_;
      auVar1._28_4_ = auVar79._28_4_;
      auVar79 = vmaskmovps_avx(auVar74,auVar1);
      *(undefined1 (*) [32])((long)*(undefined1 (*) [32])_ptr + uVar7 * 4) = auVar79;
      uVar7 = uVar7 + 8;
    } while ((uVar6 + 8 & 0x1fffffff8) != uVar7);
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

    // reduce max
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _max_avx512 = _mm512_set1_ps(-FLT_MAX);
#endif // __AVX512F__
    __m256 _max_avx = _mm256_set1_ps(-FLT_MAX);
#endif // __AVX__
    __m128 _max = _mm_set1_ps(-FLT_MAX);
#endif // __SSE2__
    float max = -FLT_MAX;
    {
        const float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _max_avx512 = _mm512_max_ps(_max_avx512, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _max_avx = _mm256_max_ps(_max_avx, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _max = _mm_max_ps(_max, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            max = std::max(max, *ptr++);
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 8)
    {
        {
            __m256 _max0 = _mm512_castps512_ps256(_max_avx512);
            __m256 _max1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_max_avx512), 1));
            _max_avx = _mm256_max_ps(_max_avx, _max0);
            _max_avx = _mm256_max_ps(_max_avx, _max1);
        }

        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
    }
#endif // __AVX512F__
    if (elempack == 4)
    {
#if __AVX512F__
        {
            __m256 _max0 = _mm512_castps512_ps256(_max_avx512);
            __m256 _max1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_max_avx512), 1));
            _max_avx = _mm256_max_ps(_max_avx, _max0);
            _max_avx = _mm256_max_ps(_max_avx, _max1);
        }
#endif // __AVX512F__
        {
            __m128 _max0 = _mm256_castps256_ps128(_max_avx);
            __m128 _max1 = _mm256_extractf128_ps(_max_avx, 1);
            _max = _mm_max_ps(_max, _max0);
            _max = _mm_max_ps(_max, _max1);
        }

        _max_avx = combine4x2_ps(_max, _max);
#if __AVX512F__
        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 1)
    {
#if __AVX__
#if __AVX512F__
        max = std::max(max, _mm512_comp_reduce_max_ps(_max_avx512));
#endif // __AVX512F__
        max = std::max(max, _mm256_reduce_max_ps(_max_avx));
#endif // __AVX__
        max = std::max(max, _mm_reduce_max_ps(_max));

        _max = _mm_set1_ps(max);
#if __AVX__
        _max_avx = combine4x2_ps(_max, _max);
#if __AVX512F__
        _max_avx512 = combine8x2_ps(_max_avx, _max_avx);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__

    // reduce exp(x - max)
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _sum_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _sum_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _sum = _mm_set1_ps(0.f);
#endif // __SSE2__
    float sum = 0.f;
    {
        float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_sub_ps(_p, _max_avx512);
            _p = exp512_ps(_p);
            _mm512_storeu_ps(ptr, _p);
            _sum_avx512 = _mm512_add_ps(_sum_avx512, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_sub_ps(_p, _max_avx);
            _p = exp256_ps(_p);
            _mm256_storeu_ps(ptr, _p);
            _sum_avx = _mm256_add_ps(_sum_avx, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_sub_ps(_p, _max);
            _p = exp_ps(_p);
            _mm_storeu_ps(ptr, _p);
            _sum = _mm_add_ps(_sum, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = expf(*ptr - max);
            *ptr = v;
            sum += v;
            ptr++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        _sum_avx512 = _mm512_div_ps(_mm512_set1_ps(1.f), _sum_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _sum0 = _mm512_castps512_ps256(_sum_avx512);
            __m256 _sum1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_sum_avx512), 1));
            _sum_avx = _mm256_add_ps(_sum_avx, _sum0);
            _sum_avx = _mm256_add_ps(_sum_avx, _sum1);
        }
#endif // __AVX512F__

        _sum_avx = _mm256_div_ps(_mm256_set1_ps(1.f), _sum_avx);

#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _sum0 = _mm512_castps512_ps256(_sum_avx512);
            __m256 _sum1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_sum_avx512), 1));
            _sum_avx = _mm256_add_ps(_sum_avx, _sum0);
            _sum_avx = _mm256_add_ps(_sum_avx, _sum1);
        }
#endif // __AVX512F__
        {
            __m128 _sum0 = _mm256_castps256_ps128(_sum_avx);
            __m128 _sum1 = _mm256_extractf128_ps(_sum_avx, 1);
            _sum = _mm_add_ps(_sum, _sum0);
            _sum = _mm_add_ps(_sum, _sum1);
        }
#endif // __AVX__

        _sum = _mm_div_ps(_mm_set1_ps(1.f), _sum);

#if __AVX__
        _sum_avx = combine4x2_ps(_sum, _sum);
#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
        sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
        sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__

        sum = 1.f / sum;

#if __SSE2__
        _sum = _mm_set1_ps(sum);
#if __AVX__
        _sum_avx = combine4x2_ps(_sum, _sum);
#if __AVX512F__
        _sum_avx512 = combine8x2_ps(_sum_avx, _sum_avx);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    // div sum
    {
        float* ptr = _ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _sum_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _sum_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _sum);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr++ *= sum;
        }
    }
}